

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

bool_t wwIsRepW(word *a,size_t n,word w)

{
  word *pwVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (n == 0) {
    uVar2 = (uint)(w == 0);
  }
  else {
    lVar4 = n - 1;
    uVar2 = (uint)(*a == w);
    while (lVar3 = lVar4 + -1, lVar4 != 0) {
      pwVar1 = a + lVar4;
      lVar4 = lVar3;
      if (*pwVar1 != w) {
        uVar2 = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

bool_t SAFE(wwIsRepW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0);
	else
	{
		ret = wordEq(a[0], w);
		while (--n)
			ret &= wordEq(a[n], w);
	}
	w = 0;
	return ret;
}